

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Vertex_*>::btAlignedObjectArray
          (btAlignedObjectArray<btConvexHullInternal::Vertex_*> *this,
          btAlignedObjectArray<btConvexHullInternal::Vertex_*> *otherArray)

{
  int iVar1;
  int iVar2;
  int i;
  Vertex **ppVVar3;
  long lVar4;
  long lVar5;
  
  this->m_ownsMemory = true;
  this->m_data = (Vertex **)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  iVar1 = otherArray->m_size;
  lVar5 = (long)iVar1;
  if (lVar5 < 1) {
    this->m_size = iVar1;
  }
  else {
    ppVVar3 = (Vertex **)btAlignedAllocInternal(lVar5 * 8,0x10);
    iVar2 = this->m_size;
    if (0 < (long)iVar2) {
      lVar4 = 0;
      do {
        ppVVar3[lVar4] = this->m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (iVar2 != lVar4);
    }
    if ((this->m_data != (Vertex **)0x0) && (this->m_ownsMemory == true)) {
      btAlignedFreeInternal(this->m_data);
    }
    this->m_ownsMemory = true;
    this->m_data = ppVVar3;
    this->m_capacity = iVar1;
    lVar4 = 0;
    do {
      this->m_data[lVar4] = (Vertex *)0x0;
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
    ppVVar3 = this->m_data;
    this->m_size = iVar1;
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        ppVVar3[lVar4] = otherArray->m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
  }
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}